

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.hpp
# Opt level: O3

__sighandler_t __thiscall
wigwag::signal<void_()>::~signal(signal<void_()> *this,int __sig,__sighandler_t __handler)

{
  signal_impl<void_(),_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
  *psVar1;
  int iVar2;
  __sighandler_t in_RAX;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  psVar1 = (this->_impl)._s._ptr._raw;
  if (psVar1 != (signal_impl<void_(),_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
                 *)0x0) {
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)
                               &(psVar1->
                                super_listenable_impl<std::function<void_()>,_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
                                ).super_lock_primitive);
    if (iVar2 != 0) {
      std::__throw_system_error(iVar2);
    }
    detail::
    listenable_impl<std::function<void_()>,_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
    ::finalize_nodes(&((this->_impl)._s._ptr._raw)->
                      super_listenable_impl<std::function<void_()>,_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
                    );
    iVar2 = pthread_mutex_unlock
                      ((pthread_mutex_t *)
                       &(((this->_impl)._s._ptr._raw)->
                        super_listenable_impl<std::function<void_()>,_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
                        ).super_lock_primitive);
    in_RAX = (__sighandler_t)CONCAT44(extraout_var,iVar2);
    psVar1 = (this->_impl)._s._ptr._raw;
    if (psVar1 != (signal_impl<void_(),_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
                   *)0x0) {
      iVar2 = (*(psVar1->super_signal_connector_impl<void_()>)._vptr_signal_connector_impl[5])();
      in_RAX = (__sighandler_t)CONCAT44(extraout_var_00,iVar2);
    }
  }
  return in_RAX;
}

Assistant:

~signal()
        {
            if (_impl)
            {
                _impl->get_lock_primitive().lock_nonrecursive();
                auto sg = detail::at_scope_exit([&] { _impl->get_lock_primitive().unlock_nonrecursive(); } );

                _impl->finalize_nodes();
            }
        }